

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

void __thiscall ThreadContext::TryExitExpirableCollectMode(ThreadContext *this)

{
  ExpirableObject *pEVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  DListNodeBase<ExpirableObject_*> *node;
  ExpirableObject **ppEVar5;
  ExpirableObject *object;
  Iterator expirableObjectIterator;
  ThreadContext *this_local;
  
  expirableObjectIterator.current = (NodeBase *)this;
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,ExpirableCollectPhase);
  if ((((!bVar3) && (bVar3 = InExpirableCollectMode(this), bVar3)) &&
      ((this->disableExpiration & 1U) == 0)) && (bVar3 = InExpirableCollectMode(this), bVar3)) {
    Output::Trace(ExpirableCollectPhase,
                  L"Checking to see whether to complete Expirable Object Collection: GC Count is %d\n"
                  ,(ulong)(uint)this->expirableCollectModeGcCount);
    if (0 < this->expirableCollectModeGcCount) {
      this->expirableCollectModeGcCount = this->expirableCollectModeGcCount + -1;
    }
    if ((this->expirableCollectModeGcCount == 0) &&
       ((bVar3 = Memory::Recycler::InCacheCleanupCollection(this->recycler), bVar3 ||
        ((DAT_01ea9efb & 1) != 0)))) {
      Output::Trace(ExpirableCollectPhase,L"Completing Expirable Object Collection\n");
      DListBase<ExpirableObject_*,_RealCount>::Iterator::Iterator
                ((Iterator *)&object,
                 &this->expirableObjectList->super_DListBase<ExpirableObject_*,_RealCount>);
      while( true ) {
        if (expirableObjectIterator.list == (DListBase<ExpirableObject_*,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                             ,0x66,"(current != nullptr)","current != nullptr");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        pEVar1 = object;
        node = DListNodeBase<ExpirableObject_*>::Next
                         (&(expirableObjectIterator.list)->super_DListNodeBase<ExpirableObject_*>);
        bVar3 = DListBase<ExpirableObject_*,_RealCount>::IsHead
                          ((DListBase<ExpirableObject_*,_RealCount> *)pEVar1,node);
        if (bVar3) break;
        expirableObjectIterator.list =
             (DListBase<ExpirableObject_*,_RealCount> *)
             DListNodeBase<ExpirableObject_*>::Next
                       (&(expirableObjectIterator.list)->super_DListNodeBase<ExpirableObject_*>);
        ppEVar5 = DListBase<ExpirableObject_*,_RealCount>::Iterator::Data((Iterator *)&object);
        pEVar1 = *ppEVar5;
        if (pEVar1 == (ExpirableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                             ,0xb9b,"(object)","object");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        bVar3 = ExpirableObject::IsObjectUsed(pEVar1);
        if (!bVar3) {
          (*(pEVar1->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[6])();
        }
      }
      this->expirableCollectModeGcCount = -1;
    }
  }
  return;
}

Assistant:

void
ThreadContext::TryExitExpirableCollectMode()
{
    // If this feature is turned off or if we're already in profile collection mode, do nothing
    // We also do nothing if expiration is explicitly disabled by someone lower down the stack
    if (PHASE_OFF1(Js::ExpirableCollectPhase) || !InExpirableCollectMode() || this->disableExpiration)
    {
        return;
    }

    if (InExpirableCollectMode())
    {
        OUTPUT_TRACE(Js::ExpirableCollectPhase, _u("Checking to see whether to complete Expirable Object Collection: GC Count is %d\n"), this->expirableCollectModeGcCount);
        if (this->expirableCollectModeGcCount > 0)
        {
            this->expirableCollectModeGcCount--;
        }

        if (this->expirableCollectModeGcCount == 0 &&
            (this->recycler->InCacheCleanupCollection() || CONFIG_FLAG(ForceExpireOnNonCacheCollect)))
        {
            OUTPUT_TRACE(Js::ExpirableCollectPhase, _u("Completing Expirable Object Collection\n"));

            ExpirableObjectList::Iterator expirableObjectIterator(this->expirableObjectList);

            while (expirableObjectIterator.Next())
            {
                ExpirableObject* object = expirableObjectIterator.Data();

                Assert(object);

                if (!object->IsObjectUsed())
                {
                    object->Expire();
                }
            }

            // Leave expirable collection mode
            expirableCollectModeGcCount = -1;
        }
    }
}